

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_logisim.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_263741::LogisimParser::~LogisimParser(LogisimParser *this)

{
  __buckets_ptr pp_Var1;
  __buckets_ptr pp_Var2;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>_>_>
  *p_Var3;
  __buckets_ptr pp_Var4;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>_>_>
  *this_00;
  __node_ptr in_RSI;
  long lVar5;
  
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->m_context).m_tunnels._M_h);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&(this->m_context).m_wires);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::Position>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::Position>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&(this->m_context).m_ipin_offsets._M_h);
  pp_Var1 = (this->m_context).m_ipin_offsets._M_h._M_buckets;
  if (&(this->m_context).m_ipin_offsets._M_h._M_single_bucket != pp_Var1) {
    in_RSI = (__node_ptr)((this->m_context).m_ipin_offsets._M_h._M_bucket_count << 3);
    operator_delete(pp_Var1,(ulong)in_RSI);
  }
  lVar5 = 0xb8;
  do {
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)((long)&this->m_xml_doc + lVar5));
    lVar5 = lVar5 + -0x30;
  } while (lVar5 != 0x58);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>,_std::allocator<std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->m_context).m_pin_locs._M_h);
  pp_Var2 = (this->m_context).m_pin_locs._M_h._M_buckets;
  if (&(this->m_context).m_pin_locs._M_h._M_single_bucket != pp_Var2) {
    in_RSI = (__node_ptr)((this->m_context).m_pin_locs._M_h._M_bucket_count << 3);
    operator_delete(pp_Var2,(ulong)in_RSI);
  }
  this_00 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>_>_>
             *)(this->m_circuits)._M_h._M_before_begin._M_nxt;
  while (this_00 !=
         (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>_>_>
          *)0x0) {
    p_Var3 = *(_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>_>_>
               **)this_00;
    std::__detail::
    _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>_>_>
    ::_M_deallocate_node(this_00,in_RSI);
    this_00 = p_Var3;
  }
  memset((this->m_circuits)._M_h._M_buckets,0,(this->m_circuits)._M_h._M_bucket_count << 3);
  (this->m_circuits)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_circuits)._M_h._M_element_count = 0;
  pp_Var4 = (this->m_circuits)._M_h._M_buckets;
  if (&(this->m_circuits)._M_h._M_single_bucket == pp_Var4) {
    return;
  }
  operator_delete(pp_Var4,(this->m_circuits)._M_h._M_bucket_count << 3);
  return;
}

Assistant:

LogisimParser(pugi::xml_document *xml_doc, LSimContext *lsim_context) : 
            m_xml_doc(xml_doc), 
            m_lsim_context(lsim_context) {
    }